

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

FieldDescriptor **
google::protobuf::compiler::cpp::anon_unknown_0::SortFieldsByNumber(Descriptor *descriptor)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  FieldDescriptor *pFVar4;
  undefined1 auVar5 [16];
  FieldDescriptor **ppFVar6;
  long lVar7;
  long lVar8;
  FieldDescriptor **ppFVar9;
  FieldDescriptor **ppFVar10;
  ulong uVar11;
  ulong uVar12;
  FieldDescriptor **__i;
  FieldDescriptor **ppFVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  long lVar16;
  
  iVar1 = *(int *)(descriptor + 0x2c);
  uVar12 = (ulong)iVar1;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (long)uVar12) {
    uVar11 = uVar12 * 8;
  }
  ppFVar6 = (FieldDescriptor **)operator_new__(uVar11);
  auVar5 = _DAT_00232930;
  if (0 < (long)uVar12) {
    lVar7 = *(long *)(descriptor + 0x30);
    lVar8 = uVar12 - 1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar14 = auVar14 ^ _DAT_00232930;
    auVar15 = _DAT_00232920;
    do {
      auVar17 = auVar15 ^ auVar5;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        *(long *)((long)ppFVar6 + lVar8) = lVar7;
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        *(long *)((long)ppFVar6 + lVar8 + 8) = lVar7 + 0x78;
      }
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
      lVar8 = lVar8 + 0x10;
      lVar7 = lVar7 + 0xf0;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar8);
  }
  if (iVar1 != 0) {
    ppFVar9 = ppFVar6 + uVar12;
    lVar8 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
              (ppFVar6,ppFVar9,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar1 < 0x11) {
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar6,ppFVar9);
    }
    else {
      ppFVar13 = ppFVar6 + 0x10;
      std::
      __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar6,ppFVar13);
      do {
        pFVar3 = ppFVar13[-1];
        pFVar4 = *ppFVar13;
        iVar2 = *(int *)(pFVar4 + 0x28);
        iVar1 = *(int *)(pFVar3 + 0x28);
        ppFVar10 = ppFVar13;
        while (iVar2 < iVar1) {
          *ppFVar10 = pFVar3;
          pFVar3 = ppFVar10[-2];
          ppFVar10 = ppFVar10 + -1;
          iVar1 = *(int *)(pFVar3 + 0x28);
        }
        *ppFVar10 = pFVar4;
        ppFVar13 = ppFVar13 + 1;
      } while (ppFVar13 != ppFVar9);
    }
  }
  return ppFVar6;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
    new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  sort(fields, fields + descriptor->field_count(),
       FieldOrderingByNumber());
  return fields;
}